

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O2

void __thiscall mocker::ir::Call::Call<>(Call *this,string *funcName)

{
  allocator_type local_31;
  undefined8 local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__IRInst_001efc48;
  (this->super_IRInst).type = Call;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Definition_001efc68;
  (this->super_Definition).dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Definition).dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Call_001f08a0;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Call_001f08c0;
  std::__cxx11::string::string((string *)&this->funcName,(string *)funcName);
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  vector(&this->args,(initializer_list<std::shared_ptr<mocker::ir::Addr>_>)ZEXT816(0),&local_31);
  return;
}

Assistant:

explicit Call(std::string funcName, Args... args)
      : IRInst(InstType::Call), Definition(nullptr),
        funcName(std::move(funcName)), args({std::move(args)...}) {}